

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_allocator::deallocate_memory
          (xml_allocator *this,void *ptr,size_t size,xml_memory_page *page)

{
  long in_RCX;
  long in_RDX;
  long *in_RDI;
  
  if (in_RCX == *in_RDI) {
    *(long *)(in_RCX + 0x18) = in_RDI[1];
  }
  *(long *)(in_RCX + 0x20) = in_RDX + *(long *)(in_RCX + 0x20);
  if (*(long *)(in_RCX + 0x20) == *(long *)(in_RCX + 0x18)) {
    if (*(long *)(in_RCX + 0x10) == 0) {
      *(undefined8 *)(in_RCX + 0x18) = 0;
      *(undefined8 *)(in_RCX + 0x20) = 0;
      in_RDI[1] = 0;
    }
    else {
      *(undefined8 *)(*(long *)(in_RCX + 8) + 0x10) = *(undefined8 *)(in_RCX + 0x10);
      *(undefined8 *)(*(long *)(in_RCX + 0x10) + 8) = *(undefined8 *)(in_RCX + 8);
      deallocate_page((xml_memory_page *)0x1e79fc);
    }
  }
  return;
}

Assistant:

void deallocate_memory(void* ptr, size_t size, xml_memory_page* page)
		{
			if (page == _root) page->busy_size = _busy_size;

			assert(ptr >= reinterpret_cast<char*>(page) + sizeof(xml_memory_page) && ptr < reinterpret_cast<char*>(page) + sizeof(xml_memory_page) + page->busy_size);
			(void)!ptr;

			page->freed_size += size;
			assert(page->freed_size <= page->busy_size);

			if (page->freed_size == page->busy_size)
			{
				if (page->next == NULL)
				{
					assert(_root == page);

					// top page freed, just reset sizes
					page->busy_size = 0;
					page->freed_size = 0;

				#ifdef PUGIXML_COMPACT
					// reset compact state to maximize efficiency
					page->compact_string_base = NULL;
					page->compact_shared_parent = NULL;
					page->compact_page_marker = NULL;
				#endif

					_busy_size = 0;
				}
				else
				{
					assert(_root != page);
					assert(page->prev);

					// remove from the list
					page->prev->next = page->next;
					page->next->prev = page->prev;

					// deallocate
					deallocate_page(page);
				}
			}
		}